

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void expand_2_i32(TCGContext_conflict9 *tcg_ctx,uint32_t dofs,uint32_t aofs,uint32_t oprsz,
                 _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_conflict9 *fni)

{
  TCGv_i32 arg;
  uint local_34;
  uint32_t i;
  TCGv_i32 t0;
  _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_conflict9 *fni_local;
  uint32_t oprsz_local;
  uint32_t aofs_local;
  uint32_t dofs_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  arg = tcg_temp_new_i32(tcg_ctx);
  for (local_34 = 0; local_34 < oprsz; local_34 = local_34 + 4) {
    tcg_gen_ld_i32(tcg_ctx,arg,tcg_ctx->cpu_env,(ulong)(aofs + local_34));
    (*fni)(tcg_ctx,arg,arg);
    tcg_gen_st_i32(tcg_ctx,arg,tcg_ctx->cpu_env,(ulong)(dofs + local_34));
  }
  tcg_temp_free_i32(tcg_ctx,arg);
  return;
}

Assistant:

static void expand_2_i32(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs, uint32_t oprsz,
                         void (*fni)(TCGContext *, TCGv_i32, TCGv_i32))
{
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
    uint32_t i;

    for (i = 0; i < oprsz; i += 4) {
        tcg_gen_ld_i32(tcg_ctx, t0, tcg_ctx->cpu_env, aofs + i);
        fni(tcg_ctx, t0, t0);
        tcg_gen_st_i32(tcg_ctx, t0, tcg_ctx->cpu_env, dofs + i);
    }
    tcg_temp_free_i32(tcg_ctx, t0);
}